

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdespacket.h
# Opt level: O0

uint8_t * __thiscall jrtplib::RTCPSDESPacket::GetPRIVPrefixData(RTCPSDESPacket *this)

{
  uint8_t *puVar1;
  size_t prefixlength;
  uint8_t *preflen;
  RTCPSDESHeader *sdeshdr;
  RTCPSDESPacket *this_local;
  
  if (((this->super_RTCPPacket).knownformat & 1U) == 0) {
    this_local = (RTCPSDESPacket *)0x0;
  }
  else if (this->currentchunk == (uint8_t *)0x0) {
    this_local = (RTCPSDESPacket *)0x0;
  }
  else {
    puVar1 = this->currentchunk + this->itemoffset;
    if (*puVar1 == '\b') {
      if (puVar1[1] == '\0') {
        this_local = (RTCPSDESPacket *)0x0;
      }
      else if (puVar1[1] - 1 < (uint)this->currentchunk[this->itemoffset + 2]) {
        this_local = (RTCPSDESPacket *)0x0;
      }
      else if (this->currentchunk[this->itemoffset + 2] == 0) {
        this_local = (RTCPSDESPacket *)0x0;
      }
      else {
        this_local = (RTCPSDESPacket *)(this->currentchunk + this->itemoffset + 3);
      }
    }
    else {
      this_local = (RTCPSDESPacket *)0x0;
    }
  }
  return (uint8_t *)this_local;
}

Assistant:

inline uint8_t *RTCPSDESPacket::GetPRIVPrefixData()
{
	if (!knownformat)
		return 0;
	if (currentchunk == 0)
		return 0;
	RTCPSDESHeader *sdeshdr = (RTCPSDESHeader *)(currentchunk+itemoffset);
	if (sdeshdr->sdesid != RTCP_SDES_ID_PRIVATE)
		return 0;
	if (sdeshdr->length == 0)
		return 0;
	uint8_t *preflen = currentchunk+itemoffset+sizeof(RTCPSDESHeader);
	size_t prefixlength = (size_t)(*preflen);
	if (prefixlength > (size_t)((sdeshdr->length)-1))
		return 0;
	if (prefixlength == 0)
		return 0;
	return (currentchunk+itemoffset+sizeof(RTCPSDESHeader)+1);
}